

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.cpp
# Opt level: O2

size_t __thiscall pstore::exchange::export_ns::ostream_base::flush(ostream_base *this)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  
  sVar3 = buffered_chars(this);
  (*this->_vptr_ostream_base[2])(this,&this->buffer_,sVar3);
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->ptr_ = pcVar1;
  return (long)pcVar2 - (long)pcVar1;
}

Assistant:

std::size_t ostream_base::flush () {
                this->flush_buffer (buffer_, this->buffered_chars ());
                ptr_ = buffer_.data ();
                return buffer_.size ();
            }